

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::convert_half_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  string sVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  runtime_error *this_00;
  char (*pacVar6) [12];
  string *psVar7;
  char (*ts_1) [13];
  uint uVar8;
  float fVar9;
  uint uVar10;
  char (*in_R9) [2];
  char buf [64];
  string local_228;
  undefined1 local_208;
  string asStack_207 [15];
  char local_1f8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined **local_180;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined8 local_16c;
  undefined1 *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined1 local_148 [32];
  undefined1 *local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  undefined4 local_108;
  undefined2 local_104;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [32];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [32];
  undefined4 local_88;
  undefined8 local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_1c8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1c8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = (c->m).c[col].r[row].u32;
  uVar3 = (uVar2 & 0xffff) >> 0xf;
  uVar8 = uVar2 >> 10 & 0x1f;
  uVar10 = uVar2 & 0x3ff;
  if (uVar8 == 0x1f) {
    uVar3 = uVar3 << 0x1f;
    if (uVar10 != 0) {
      uVar3 = uVar3 | (uVar2 & 0xffff) << 0xd;
    }
    fVar9 = (float)(uVar3 | 0x7f800000);
  }
  else {
    if (uVar8 == 0) {
      if (uVar10 == 0) {
        fVar9 = (float)(uVar3 << 0x1f);
        goto LAB_001ea3af;
      }
      uVar2 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar8 = (uVar2 ^ 0xffffffe0) + 0x17;
      uVar10 = uVar10 << (~(byte)uVar2 + 0xb & 0x1f) & 0x1fffbfe;
    }
    fVar9 = (float)(uVar8 * 0x800000 + 0x38000000 | uVar3 << 0x1f | uVar10 << 0xd);
  }
LAB_001ea3af:
  if ((NAN(fVar9) || NAN(fVar9)) || ABS(fVar9) == INFINITY) {
    local_160 = local_148;
    local_178 = 0;
    local_180 = &PTR__SPIRType_003d5290;
    local_170 = 0;
    local_158 = 0;
    local_150 = 8;
    local_120 = 0;
    local_118 = 8;
    local_108 = 0;
    local_104 = 0;
    local_100 = 8;
    local_f0 = 0;
    local_e8 = 8;
    local_b8 = 0;
    local_b0 = 8;
    local_88 = 0;
    local_70 = 0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_174 = 0xc;
    local_16c = 0x100000001;
    local_128 = local_110;
    local_f8 = local_e0;
    local_c0 = local_a8;
    if (fVar9 < INFINITY) {
      if (-INFINITY < fVar9) {
        if (!NAN(fVar9)) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          _local_208 = local_1f8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_208,"Cannot represent non-finite floating point constant.","")
          ;
          ::std::runtime_error::runtime_error(this_00,(string *)&local_208);
          *(undefined ***)this_00 = &PTR__runtime_error_003d4e98;
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        pacVar6 = (char (*) [12])0x0;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_228,this,&local_180);
        join<std::__cxx11::string,char_const(&)[12]>
                  ((string *)&local_208,(spirv_cross *)&local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "(0.0 / 0.0)",pacVar6);
      }
      else {
        ts_1 = (char (*) [13])0x0;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_228,this,&local_180);
        join<std::__cxx11::string,char_const(&)[13]>
                  ((string *)&local_208,(spirv_cross *)&local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "(-1.0 / 0.0)",ts_1);
      }
    }
    else {
      pacVar6 = (char (*) [12])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_228,this,&local_180);
      join<std::__cxx11::string,char_const(&)[12]>
                ((string *)&local_208,(spirv_cross *)&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(1.0 / 0.0)",
                 pacVar6);
    }
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_208);
    if (_local_208 != local_1f8) {
      operator_delete(_local_208);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    local_180 = &PTR__SPIRType_003d5290;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_f0 = 0;
    if (local_f8 != local_e0) {
      free(local_f8);
    }
    local_120 = 0;
    if (local_128 == local_110) goto LAB_001ea87a;
  }
  else {
    local_160 = local_148;
    local_178 = 0;
    local_180 = &PTR__SPIRType_003d5290;
    local_170 = 0;
    local_158 = 0;
    local_150 = 8;
    local_120 = 0;
    local_118 = 8;
    local_108 = 0;
    local_104 = 0;
    local_100 = 8;
    local_f8 = local_e0;
    local_f0 = 0;
    local_e8 = 8;
    local_b8 = 0;
    local_b0 = 8;
    local_88 = 0;
    local_70 = 0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_174 = 0xc;
    local_16c = 0x100000001;
    local_128 = local_110;
    local_c0 = local_a8;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1a0,this,&local_180,0);
    sVar1 = (string)this->current_locale_radix_character;
    sprintf(&local_208,"%.32g",SUB84((double)fVar9,0));
    if (local_208 != (string)0x0 && sVar1 != (string)0x2e) {
      psVar7 = asStack_207;
      do {
        if (local_208 == sVar1) {
          psVar7[-1] = (string)0x2e;
        }
        local_208 = *psVar7;
        psVar7 = psVar7 + 1;
      } while (local_208 != (string)0x0);
    }
    pcVar4 = strchr(&local_208,0x2e);
    if ((pcVar4 == (char *)0x0) && (pcVar4 = strchr(&local_208,0x65), pcVar4 == (char *)0x0)) {
      sVar5 = strlen(&local_208);
      *(undefined2 *)(&local_208 + sVar5) = 0x302e;
      asStack_207[sVar5 + 1] = (string)0x0;
    }
    local_1c0[0] = local_1b0;
    sVar5 = strlen(&local_208);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,&local_208,&local_208 + sVar5);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (&local_228,(spirv_cross *)local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c56f,
               (char (*) [2])local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0]);
    }
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    local_180 = &PTR__SPIRType_003d5290;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_f0 = 0;
    if (local_f8 != local_e0) {
      free(local_f8);
    }
    local_120 = 0;
    if (local_128 == local_110) goto LAB_001ea87a;
  }
  local_120 = 0;
  free(local_128);
LAB_001ea87a:
  local_158 = 0;
  if (local_160 != local_148) {
    free(local_160);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_half_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f16(col, row);

	// There is no literal "hf" in GL_NV_gpu_shader5, so to avoid lots
	// of complicated workarounds, just value-cast to the half type always.
	if (std::isnan(float_value) || std::isinf(float_value))
	{
		SPIRType type;
		type.basetype = SPIRType::Half;
		type.vecsize = 1;
		type.columns = 1;

		if (float_value == numeric_limits<float>::infinity())
			res = join(type_to_glsl(type), "(1.0 / 0.0)");
		else if (float_value == -numeric_limits<float>::infinity())
			res = join(type_to_glsl(type), "(-1.0 / 0.0)");
		else if (std::isnan(float_value))
			res = join(type_to_glsl(type), "(0.0 / 0.0)");
		else
			SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
	}
	else
	{
		SPIRType type;
		type.basetype = SPIRType::Half;
		type.vecsize = 1;
		type.columns = 1;
		res = join(type_to_glsl(type), "(", convert_to_string(float_value, current_locale_radix_character), ")");
	}

	return res;
}